

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_importtype_t *
wasm_importtype_new(wasm_name_t *module,wasm_name_t *name,wasm_externtype_t *type)

{
  wasm_importtype_t *this;
  pointer *__ptr;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_b8;
  string local_b0;
  string local_90;
  ImportType local_70;
  
  this = (wasm_importtype_t *)operator_new(0x70);
  ToString_abi_cxx11_(&local_90,module);
  ToString_abi_cxx11_(&local_b0,name);
  (*((type->I)._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&local_b8);
  wabt::interp::ImportType::ImportType
            (&local_70,&local_90,&local_b0,
             (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *
             )&local_b8);
  wasm_importtype_t::wasm_importtype_t(this,&local_70);
  wabt::interp::ImportType::~ImportType(&local_70);
  if (local_b8._M_head_impl != (ExternType *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_ExternType[1])();
  }
  local_b8._M_head_impl = (ExternType *)0x0;
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return this;
}

Assistant:

own wasm_importtype_t* wasm_importtype_new(own wasm_name_t* module,
                                           own wasm_name_t* name,
                                           own wasm_externtype_t* type) {
  return new wasm_importtype_t{
      ImportType{ToString(module), ToString(name), type->I->Clone()}};
}